

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

string * __thiscall
blc::tools::VFile::getCache_abi_cxx11_(string *__return_storage_ptr__,VFile *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_cache);
  return __return_storage_ptr__;
}

Assistant:

std::string blc::tools::VFile::getCache() const {
	return (this->_cache);
}